

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O0

void pzgeom::TPZQuadraticQuad::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  long *plVar8;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int i_2;
  TPZManVector<double,_3> co_1;
  int node;
  int is;
  int nsides;
  TPZGeoEl *gel;
  int64_t index;
  int j;
  int i_1;
  int i;
  TPZManVector<long,_4> nodeindexes;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> co;
  int64_t in_stack_fffffffffffffd68;
  TPZGeoMesh *in_stack_fffffffffffffd70;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffd78;
  TPZGeoEl *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int64_t in_stack_fffffffffffffda8;
  TPZManVector<double,_3> *in_stack_fffffffffffffdb0;
  int local_18c;
  TPZVec<double> local_188;
  int local_14c;
  int local_148;
  int local_144;
  TPZGeoEl *local_140;
  undefined1 local_138 [12];
  int local_12c;
  undefined8 local_128;
  int local_120;
  int local_11c;
  TPZVec<long> local_118 [2];
  TPZVec<double> local_d8 [2];
  double *local_90 [3];
  int64_t in_stack_ffffffffffffff88;
  TPZGeoMesh *in_stack_ffffffffffffff90;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  uint local_c;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
    pdVar7 = TPZVec<double>::operator[](local_20,(long)local_11c);
    dVar1 = *pdVar7;
    pdVar7 = TPZVec<double>::operator[](local_d8,(long)local_11c);
    *pdVar7 = dVar1 / 3.0;
    pdVar7 = TPZVec<double>::operator[](local_20,(long)local_11c);
    dVar1 = *pdVar7;
    pdVar7 = TPZVec<double>::operator[](local_18,(long)local_11c);
    dVar2 = *pdVar7;
    pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&local_d8[2].fStore,(long)local_11c);
    *pdVar7 = dVar1 * 0.5 + dVar2;
  }
  for (local_120 = 0; local_120 < 4; local_120 = local_120 + 1) {
    pztopology::TPZQuadrilateral::ParametricDomainNodeCoord
              ((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (TPZVec<double> *)in_stack_fffffffffffffd78);
    local_128 = 0;
    TPZManVector<double,_3>::Resize
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (double *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&local_d8[2].fStore,(long)local_12c);
      dVar1 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_d8,(long)local_12c);
      dVar2 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](&local_58,(long)local_12c);
      dVar3 = *pdVar7;
      iVar4 = rand();
      pdVar7 = TPZVec<double>::operator[](&local_58,(long)local_12c);
      *pdVar7 = dVar2 * dVar3 + dVar1 + ((double)iVar4 * 0.2) / 2147483647.0 + -0.1;
    }
    TPZGeoMesh::NodeVec(local_8);
    iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffd78);
    plVar8 = TPZVec<long>::operator[](local_118,(long)local_120);
    *plVar8 = (long)iVar4;
    TPZGeoMesh::NodeVec(local_8);
    TPZVec<long>::operator[](local_118,(long)local_120);
    in_stack_fffffffffffffdb0 =
         (TPZManVector<double,_3> *)
         TPZChunkVector<TPZGeoNode,_10>::operator[]
                   ((TPZChunkVector<TPZGeoNode,_10> *)
                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    TPZGeoNode::Initialize
              ((TPZGeoNode *)in_stack_fffffffffffffd80,(TPZVec<double> *)in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70);
  }
  (*(local_8->super_TPZSavable)._vptr_TPZSavable[0xc])
            (local_8,3,local_118,(ulong)local_c,local_138,1);
  local_140 = TPZGeoMesh::Element(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_144 = (**(code **)(*(long *)local_140 + 0xf0))();
  for (local_148 = 0; local_148 < local_144; local_148 = local_148 + 1) {
    (**(code **)(*(long *)local_140 + 0x180))(local_140,local_148);
  }
  local_140 = TPZChangeEl::ChangeToQuadratic(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar4 = (**(code **)(*(long *)local_140 + 0x98))();
  local_14c = iVar4;
  while( true ) {
    iVar6 = local_14c;
    iVar5 = (**(code **)(*(long *)local_140 + 0x90))();
    if (iVar5 <= iVar6) break;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)CONCAT44(iVar4,iVar5),
               CONCAT44(iVar6,in_stack_fffffffffffffd88));
    in_stack_fffffffffffffd80 =
         (TPZGeoEl *)
         TPZGeoEl::NodePtr(in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20)
                          );
    TPZGeoNode::GetCoordinates
              ((TPZGeoNode *)in_stack_fffffffffffffd80,(TPZVec<double> *)in_stack_fffffffffffffd78);
    for (local_18c = 0; local_18c < 3; local_18c = local_18c + 1) {
      iVar6 = rand();
      in_stack_fffffffffffffd70 = (TPZGeoMesh *)(((double)iVar6 * 0.2) / 2147483647.0 + -0.1);
      in_stack_fffffffffffffd78 =
           (TPZAdmChunkVector<TPZGeoNode,_10> *)
           TPZVec<double>::operator[](&local_188,(long)local_18c);
      (in_stack_fffffffffffffd78->super_TPZChunkVector<TPZGeoNode,_10>).super_TPZSavable.
      _vptr_TPZSavable =
           (_func_int **)
           ((double)in_stack_fffffffffffffd70 +
           (double)(in_stack_fffffffffffffd78->super_TPZChunkVector<TPZGeoNode,_10>).
                   super_TPZSavable._vptr_TPZSavable);
    }
    TPZGeoEl::NodePtr(in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    TPZGeoNode::SetCoord
              ((TPZGeoNode *)in_stack_fffffffffffffd80,(TPZVec<double> *)in_stack_fffffffffffffd78);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
    local_14c = local_14c + 1;
  }
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffd70);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void TPZQuadraticQuad::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,4> nodeindexes(NCornerNodes);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = size[i]/2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        co.Resize(3,0.);
        for (int j=0; j<3; j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EQuadrilateral, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is=0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh, index);
    for (int node = gel->NCornerNodes(); node < gel->NNodes(); node++) {
        TPZManVector<REAL,3> co(3);
        gel->NodePtr(node)->GetCoordinates(co);
        for (int i=0; i<3; i++) {
            co[i] += (0.2*rand())/RAND_MAX - 0.1;
        }
        gel->NodePtr(node)->SetCoord(co);
    }
}